

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool isPolicyNewerThan(PolicyID id,uint majorV,uint minorV,uint patchV)

{
  bool local_b8;
  bool local_b7;
  bool local_b6;
  bool local_b5;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  bool local_b0;
  bool local_af;
  bool local_ae;
  bool local_ad;
  bool local_ac;
  bool local_ab;
  bool local_aa;
  bool local_a9;
  bool local_a8;
  bool local_a7;
  bool local_a6;
  bool local_a5;
  bool local_a4;
  bool local_a3;
  bool local_a2;
  bool local_a1;
  bool local_a0;
  bool local_9f;
  bool local_9e;
  bool local_9d;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  bool local_98;
  bool local_97;
  bool local_96;
  bool local_95;
  bool local_94;
  bool local_93;
  bool local_92;
  bool local_91;
  bool local_90;
  bool local_8f;
  bool local_8e;
  bool local_8d;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  bool local_88;
  bool local_87;
  bool local_86;
  bool local_85;
  bool local_84;
  bool local_83;
  bool local_82;
  bool local_81;
  bool local_80;
  bool local_7f;
  bool local_7e;
  bool local_7d;
  bool local_7c;
  bool local_7b;
  bool local_7a;
  bool local_79;
  bool local_78;
  bool local_77;
  bool local_76;
  bool local_75;
  bool local_74;
  bool local_73;
  bool local_72;
  bool local_71;
  bool local_70;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  bool local_6c;
  bool local_6b;
  bool local_6a;
  bool local_69;
  bool local_68;
  bool local_67;
  bool local_66;
  bool local_65;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  bool local_58;
  bool local_57;
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  bool local_50;
  bool local_4f;
  bool local_4e;
  bool local_4d;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  bool local_41;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  bool local_38;
  bool local_37;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  uint patchV_local;
  uint minorV_local;
  uint majorV_local;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    local_29 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_29 = true, 6 < minorV + 1)))) {
      local_2a = false;
      if ((majorV == 2) && (local_2a = false, minorV == 6)) {
        local_2a = patchV == 0xffffffff;
      }
      local_29 = local_2a;
    }
    majorV_local._3_1_ = local_29;
    break;
  case CMP0001:
    local_2b = true;
    if ((1 < majorV) && ((majorV != 2 || (local_2b = true, 6 < minorV + 1)))) {
      local_2c = false;
      if ((majorV == 2) && (local_2c = false, minorV == 6)) {
        local_2c = patchV == 0xffffffff;
      }
      local_2b = local_2c;
    }
    majorV_local._3_1_ = local_2b;
    break;
  case CMP0002:
    local_2d = true;
    if ((1 < majorV) && ((majorV != 2 || (local_2d = true, 6 < minorV + 1)))) {
      local_2e = false;
      if ((majorV == 2) && (local_2e = false, minorV == 6)) {
        local_2e = patchV == 0xffffffff;
      }
      local_2d = local_2e;
    }
    majorV_local._3_1_ = local_2d;
    break;
  case CMP0003:
    local_2f = true;
    if ((1 < majorV) && ((majorV != 2 || (local_2f = true, 6 < minorV + 1)))) {
      local_30 = false;
      if ((majorV == 2) && (local_30 = false, minorV == 6)) {
        local_30 = patchV == 0xffffffff;
      }
      local_2f = local_30;
    }
    majorV_local._3_1_ = local_2f;
    break;
  case CMP0004:
    local_31 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_31 = true, 6 < minorV + 1)))) {
      local_32 = false;
      if ((majorV == 2) && (local_32 = false, minorV == 6)) {
        local_32 = patchV == 0xffffffff;
      }
      local_31 = local_32;
    }
    majorV_local._3_1_ = local_31;
    break;
  case CMP0005:
    local_33 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_33 = true, 6 < minorV + 1)))) {
      local_34 = false;
      if ((majorV == 2) && (local_34 = false, minorV == 6)) {
        local_34 = patchV == 0xffffffff;
      }
      local_33 = local_34;
    }
    majorV_local._3_1_ = local_33;
    break;
  case CMP0006:
    local_35 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_35 = true, 6 < minorV + 1)))) {
      local_36 = false;
      if ((majorV == 2) && (local_36 = false, minorV == 6)) {
        local_36 = patchV == 0xffffffff;
      }
      local_35 = local_36;
    }
    majorV_local._3_1_ = local_35;
    break;
  case CMP0007:
    local_37 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_37 = true, 6 < minorV + 1)))) {
      local_38 = false;
      if ((majorV == 2) && (local_38 = false, minorV == 6)) {
        local_38 = patchV == 0xffffffff;
      }
      local_37 = local_38;
    }
    majorV_local._3_1_ = local_37;
    break;
  case CMP0008:
    local_39 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_39 = true, 6 < minorV + 1)))) {
      local_3a = false;
      if ((majorV == 2) && (local_3a = false, minorV == 6)) {
        local_3a = patchV + 1 < 2;
      }
      local_39 = local_3a;
    }
    majorV_local._3_1_ = local_39;
    break;
  case CMP0009:
    local_3b = true;
    if ((1 < majorV) && ((majorV != 2 || (local_3b = true, 6 < minorV + 1)))) {
      local_3c = false;
      if ((majorV == 2) && (local_3c = false, minorV == 6)) {
        local_3c = patchV + 1 < 3;
      }
      local_3b = local_3c;
    }
    majorV_local._3_1_ = local_3b;
    break;
  case CMP0010:
    local_3d = true;
    if ((1 < majorV) && ((majorV != 2 || (local_3d = true, 6 < minorV + 1)))) {
      local_3e = false;
      if ((majorV == 2) && (local_3e = false, minorV == 6)) {
        local_3e = patchV + 1 < 4;
      }
      local_3d = local_3e;
    }
    majorV_local._3_1_ = local_3d;
    break;
  case CMP0011:
    local_3f = true;
    if ((1 < majorV) && ((majorV != 2 || (local_3f = true, 6 < minorV + 1)))) {
      local_40 = false;
      if ((majorV == 2) && (local_40 = false, minorV == 6)) {
        local_40 = patchV + 1 < 4;
      }
      local_3f = local_40;
    }
    majorV_local._3_1_ = local_3f;
    break;
  case CMP0012:
    local_41 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_41 = true, 8 < minorV + 1)))) {
      local_42 = false;
      if ((majorV == 2) && (local_42 = false, minorV == 8)) {
        local_42 = patchV == 0xffffffff;
      }
      local_41 = local_42;
    }
    majorV_local._3_1_ = local_41;
    break;
  case CMP0013:
    local_43 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_43 = true, 8 < minorV + 1)))) {
      local_44 = false;
      if ((majorV == 2) && (local_44 = false, minorV == 8)) {
        local_44 = patchV == 0xffffffff;
      }
      local_43 = local_44;
    }
    majorV_local._3_1_ = local_43;
    break;
  case CMP0014:
    local_45 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_45 = true, 8 < minorV + 1)))) {
      local_46 = false;
      if ((majorV == 2) && (local_46 = false, minorV == 8)) {
        local_46 = patchV == 0xffffffff;
      }
      local_45 = local_46;
    }
    majorV_local._3_1_ = local_45;
    break;
  case CMP0015:
    local_47 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_47 = true, 8 < minorV + 1)))) {
      local_48 = false;
      if ((majorV == 2) && (local_48 = false, minorV == 8)) {
        local_48 = patchV + 1 < 2;
      }
      local_47 = local_48;
    }
    majorV_local._3_1_ = local_47;
    break;
  case CMP0016:
    local_49 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_49 = true, 8 < minorV + 1)))) {
      local_4a = false;
      if ((majorV == 2) && (local_4a = false, minorV == 8)) {
        local_4a = patchV + 1 < 4;
      }
      local_49 = local_4a;
    }
    majorV_local._3_1_ = local_49;
    break;
  case CMP0017:
    local_4b = true;
    if ((1 < majorV) && ((majorV != 2 || (local_4b = true, 8 < minorV + 1)))) {
      local_4c = false;
      if ((majorV == 2) && (local_4c = false, minorV == 8)) {
        local_4c = patchV + 1 < 5;
      }
      local_4b = local_4c;
    }
    majorV_local._3_1_ = local_4b;
    break;
  case CMP0018:
    local_4d = true;
    if ((1 < majorV) && ((majorV != 2 || (local_4d = true, 8 < minorV + 1)))) {
      local_4e = false;
      if ((majorV == 2) && (local_4e = false, minorV == 8)) {
        local_4e = patchV + 1 < 10;
      }
      local_4d = local_4e;
    }
    majorV_local._3_1_ = local_4d;
    break;
  case CMP0019:
    local_4f = true;
    if ((1 < majorV) && ((majorV != 2 || (local_4f = true, 8 < minorV + 1)))) {
      local_50 = false;
      if ((majorV == 2) && (local_50 = false, minorV == 8)) {
        local_50 = patchV + 1 < 0xc;
      }
      local_4f = local_50;
    }
    majorV_local._3_1_ = local_4f;
    break;
  case CMP0020:
    local_51 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_51 = true, 8 < minorV + 1)))) {
      local_52 = false;
      if ((majorV == 2) && (local_52 = false, minorV == 8)) {
        local_52 = patchV + 1 < 0xc;
      }
      local_51 = local_52;
    }
    majorV_local._3_1_ = local_51;
    break;
  case CMP0021:
    local_53 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_53 = true, 8 < minorV + 1)))) {
      local_54 = false;
      if ((majorV == 2) && (local_54 = false, minorV == 8)) {
        local_54 = patchV + 1 < 0xd;
      }
      local_53 = local_54;
    }
    majorV_local._3_1_ = local_53;
    break;
  case CMP0022:
    local_55 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_55 = true, 8 < minorV + 1)))) {
      local_56 = false;
      if ((majorV == 2) && (local_56 = false, minorV == 8)) {
        local_56 = patchV + 1 < 0xd;
      }
      local_55 = local_56;
    }
    majorV_local._3_1_ = local_55;
    break;
  case CMP0023:
    local_57 = true;
    if ((1 < majorV) && ((majorV != 2 || (local_57 = true, 8 < minorV + 1)))) {
      local_58 = false;
      if ((majorV == 2) && (local_58 = false, minorV == 8)) {
        local_58 = patchV + 1 < 0xd;
      }
      local_57 = local_58;
    }
    majorV_local._3_1_ = local_57;
    break;
  case CMP0024:
    local_59 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_59 = true, minorV != 0xffffffff)))) {
      local_5a = false;
      if ((majorV == 3) && (local_5a = false, minorV == 0)) {
        local_5a = patchV == 0xffffffff;
      }
      local_59 = local_5a;
    }
    majorV_local._3_1_ = local_59;
    break;
  case CMP0025:
    local_5b = true;
    if ((2 < majorV) && ((majorV != 3 || (local_5b = true, minorV != 0xffffffff)))) {
      local_5c = false;
      if ((majorV == 3) && (local_5c = false, minorV == 0)) {
        local_5c = patchV == 0xffffffff;
      }
      local_5b = local_5c;
    }
    majorV_local._3_1_ = local_5b;
    break;
  case CMP0026:
    local_5d = true;
    if ((2 < majorV) && ((majorV != 3 || (local_5d = true, minorV != 0xffffffff)))) {
      local_5e = false;
      if ((majorV == 3) && (local_5e = false, minorV == 0)) {
        local_5e = patchV == 0xffffffff;
      }
      local_5d = local_5e;
    }
    majorV_local._3_1_ = local_5d;
    break;
  case CMP0027:
    local_5f = true;
    if ((2 < majorV) && ((majorV != 3 || (local_5f = true, minorV != 0xffffffff)))) {
      local_60 = false;
      if ((majorV == 3) && (local_60 = false, minorV == 0)) {
        local_60 = patchV == 0xffffffff;
      }
      local_5f = local_60;
    }
    majorV_local._3_1_ = local_5f;
    break;
  case CMP0028:
    local_61 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_61 = true, minorV != 0xffffffff)))) {
      local_62 = false;
      if ((majorV == 3) && (local_62 = false, minorV == 0)) {
        local_62 = patchV == 0xffffffff;
      }
      local_61 = local_62;
    }
    majorV_local._3_1_ = local_61;
    break;
  case CMP0029:
    local_63 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_63 = true, minorV != 0xffffffff)))) {
      local_64 = false;
      if ((majorV == 3) && (local_64 = false, minorV == 0)) {
        local_64 = patchV == 0xffffffff;
      }
      local_63 = local_64;
    }
    majorV_local._3_1_ = local_63;
    break;
  case CMP0030:
    local_65 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_65 = true, minorV != 0xffffffff)))) {
      local_66 = false;
      if ((majorV == 3) && (local_66 = false, minorV == 0)) {
        local_66 = patchV == 0xffffffff;
      }
      local_65 = local_66;
    }
    majorV_local._3_1_ = local_65;
    break;
  case CMP0031:
    local_67 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_67 = true, minorV != 0xffffffff)))) {
      local_68 = false;
      if ((majorV == 3) && (local_68 = false, minorV == 0)) {
        local_68 = patchV == 0xffffffff;
      }
      local_67 = local_68;
    }
    majorV_local._3_1_ = local_67;
    break;
  case CMP0032:
    local_69 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_69 = true, minorV != 0xffffffff)))) {
      local_6a = false;
      if ((majorV == 3) && (local_6a = false, minorV == 0)) {
        local_6a = patchV == 0xffffffff;
      }
      local_69 = local_6a;
    }
    majorV_local._3_1_ = local_69;
    break;
  case CMP0033:
    local_6b = true;
    if ((2 < majorV) && ((majorV != 3 || (local_6b = true, minorV != 0xffffffff)))) {
      local_6c = false;
      if ((majorV == 3) && (local_6c = false, minorV == 0)) {
        local_6c = patchV == 0xffffffff;
      }
      local_6b = local_6c;
    }
    majorV_local._3_1_ = local_6b;
    break;
  case CMP0034:
    local_6d = true;
    if ((2 < majorV) && ((majorV != 3 || (local_6d = true, minorV != 0xffffffff)))) {
      local_6e = false;
      if ((majorV == 3) && (local_6e = false, minorV == 0)) {
        local_6e = patchV == 0xffffffff;
      }
      local_6d = local_6e;
    }
    majorV_local._3_1_ = local_6d;
    break;
  case CMP0035:
    local_6f = true;
    if ((2 < majorV) && ((majorV != 3 || (local_6f = true, minorV != 0xffffffff)))) {
      local_70 = false;
      if ((majorV == 3) && (local_70 = false, minorV == 0)) {
        local_70 = patchV == 0xffffffff;
      }
      local_6f = local_70;
    }
    majorV_local._3_1_ = local_6f;
    break;
  case CMP0036:
    local_71 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_71 = true, minorV != 0xffffffff)))) {
      local_72 = false;
      if ((majorV == 3) && (local_72 = false, minorV == 0)) {
        local_72 = patchV == 0xffffffff;
      }
      local_71 = local_72;
    }
    majorV_local._3_1_ = local_71;
    break;
  case CMP0037:
    local_73 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_73 = true, minorV != 0xffffffff)))) {
      local_74 = false;
      if ((majorV == 3) && (local_74 = false, minorV == 0)) {
        local_74 = patchV == 0xffffffff;
      }
      local_73 = local_74;
    }
    majorV_local._3_1_ = local_73;
    break;
  case CMP0038:
    local_75 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_75 = true, minorV != 0xffffffff)))) {
      local_76 = false;
      if ((majorV == 3) && (local_76 = false, minorV == 0)) {
        local_76 = patchV == 0xffffffff;
      }
      local_75 = local_76;
    }
    majorV_local._3_1_ = local_75;
    break;
  case CMP0039:
    local_77 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_77 = true, minorV != 0xffffffff)))) {
      local_78 = false;
      if ((majorV == 3) && (local_78 = false, minorV == 0)) {
        local_78 = patchV == 0xffffffff;
      }
      local_77 = local_78;
    }
    majorV_local._3_1_ = local_77;
    break;
  case CMP0040:
    local_79 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_79 = true, minorV != 0xffffffff)))) {
      local_7a = false;
      if ((majorV == 3) && (local_7a = false, minorV == 0)) {
        local_7a = patchV == 0xffffffff;
      }
      local_79 = local_7a;
    }
    majorV_local._3_1_ = local_79;
    break;
  case CMP0041:
    local_7b = true;
    if ((2 < majorV) && ((majorV != 3 || (local_7b = true, minorV != 0xffffffff)))) {
      local_7c = false;
      if ((majorV == 3) && (local_7c = false, minorV == 0)) {
        local_7c = patchV == 0xffffffff;
      }
      local_7b = local_7c;
    }
    majorV_local._3_1_ = local_7b;
    break;
  case CMP0042:
    local_7d = true;
    if ((2 < majorV) && ((majorV != 3 || (local_7d = true, minorV != 0xffffffff)))) {
      local_7e = false;
      if ((majorV == 3) && (local_7e = false, minorV == 0)) {
        local_7e = patchV == 0xffffffff;
      }
      local_7d = local_7e;
    }
    majorV_local._3_1_ = local_7d;
    break;
  case CMP0043:
    local_7f = true;
    if ((2 < majorV) && ((majorV != 3 || (local_7f = true, minorV != 0xffffffff)))) {
      local_80 = false;
      if ((majorV == 3) && (local_80 = false, minorV == 0)) {
        local_80 = patchV == 0xffffffff;
      }
      local_7f = local_80;
    }
    majorV_local._3_1_ = local_7f;
    break;
  case CMP0044:
    local_81 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_81 = true, minorV != 0xffffffff)))) {
      local_82 = false;
      if ((majorV == 3) && (local_82 = false, minorV == 0)) {
        local_82 = patchV == 0xffffffff;
      }
      local_81 = local_82;
    }
    majorV_local._3_1_ = local_81;
    break;
  case CMP0045:
    local_83 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_83 = true, minorV != 0xffffffff)))) {
      local_84 = false;
      if ((majorV == 3) && (local_84 = false, minorV == 0)) {
        local_84 = patchV == 0xffffffff;
      }
      local_83 = local_84;
    }
    majorV_local._3_1_ = local_83;
    break;
  case CMP0046:
    local_85 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_85 = true, minorV != 0xffffffff)))) {
      local_86 = false;
      if ((majorV == 3) && (local_86 = false, minorV == 0)) {
        local_86 = patchV == 0xffffffff;
      }
      local_85 = local_86;
    }
    majorV_local._3_1_ = local_85;
    break;
  case CMP0047:
    local_87 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_87 = true, minorV != 0xffffffff)))) {
      local_88 = false;
      if ((majorV == 3) && (local_88 = false, minorV == 0)) {
        local_88 = patchV == 0xffffffff;
      }
      local_87 = local_88;
    }
    majorV_local._3_1_ = local_87;
    break;
  case CMP0048:
    local_89 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_89 = true, minorV != 0xffffffff)))) {
      local_8a = false;
      if ((majorV == 3) && (local_8a = false, minorV == 0)) {
        local_8a = patchV == 0xffffffff;
      }
      local_89 = local_8a;
    }
    majorV_local._3_1_ = local_89;
    break;
  case CMP0049:
    local_8b = true;
    if ((2 < majorV) && ((majorV != 3 || (local_8b = true, minorV != 0xffffffff)))) {
      local_8c = false;
      if ((majorV == 3) && (local_8c = false, minorV == 0)) {
        local_8c = patchV == 0xffffffff;
      }
      local_8b = local_8c;
    }
    majorV_local._3_1_ = local_8b;
    break;
  case CMP0050:
    local_8d = true;
    if ((2 < majorV) && ((majorV != 3 || (local_8d = true, minorV != 0xffffffff)))) {
      local_8e = false;
      if ((majorV == 3) && (local_8e = false, minorV == 0)) {
        local_8e = patchV == 0xffffffff;
      }
      local_8d = local_8e;
    }
    majorV_local._3_1_ = local_8d;
    break;
  case CMP0051:
    local_8f = true;
    if ((2 < majorV) && ((majorV != 3 || (local_8f = true, 1 < minorV + 1)))) {
      local_90 = false;
      if ((majorV == 3) && (local_90 = false, minorV == 1)) {
        local_90 = patchV == 0xffffffff;
      }
      local_8f = local_90;
    }
    majorV_local._3_1_ = local_8f;
    break;
  case CMP0052:
    local_91 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_91 = true, 1 < minorV + 1)))) {
      local_92 = false;
      if ((majorV == 3) && (local_92 = false, minorV == 1)) {
        local_92 = patchV == 0xffffffff;
      }
      local_91 = local_92;
    }
    majorV_local._3_1_ = local_91;
    break;
  case CMP0053:
    local_93 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_93 = true, 1 < minorV + 1)))) {
      local_94 = false;
      if ((majorV == 3) && (local_94 = false, minorV == 1)) {
        local_94 = patchV == 0xffffffff;
      }
      local_93 = local_94;
    }
    majorV_local._3_1_ = local_93;
    break;
  case CMP0054:
    local_95 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_95 = true, 1 < minorV + 1)))) {
      local_96 = false;
      if ((majorV == 3) && (local_96 = false, minorV == 1)) {
        local_96 = patchV == 0xffffffff;
      }
      local_95 = local_96;
    }
    majorV_local._3_1_ = local_95;
    break;
  case CMP0055:
    local_97 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_97 = true, 2 < minorV + 1)))) {
      local_98 = false;
      if ((majorV == 3) && (local_98 = false, minorV == 2)) {
        local_98 = patchV == 0xffffffff;
      }
      local_97 = local_98;
    }
    majorV_local._3_1_ = local_97;
    break;
  case CMP0056:
    local_99 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_99 = true, 2 < minorV + 1)))) {
      local_9a = false;
      if ((majorV == 3) && (local_9a = false, minorV == 2)) {
        local_9a = patchV == 0xffffffff;
      }
      local_99 = local_9a;
    }
    majorV_local._3_1_ = local_99;
    break;
  case CMP0057:
    local_9b = true;
    if ((2 < majorV) && ((majorV != 3 || (local_9b = true, 3 < minorV + 1)))) {
      local_9c = false;
      if ((majorV == 3) && (local_9c = false, minorV == 3)) {
        local_9c = patchV == 0xffffffff;
      }
      local_9b = local_9c;
    }
    majorV_local._3_1_ = local_9b;
    break;
  case CMP0058:
    local_9d = true;
    if ((2 < majorV) && ((majorV != 3 || (local_9d = true, 3 < minorV + 1)))) {
      local_9e = false;
      if ((majorV == 3) && (local_9e = false, minorV == 3)) {
        local_9e = patchV == 0xffffffff;
      }
      local_9d = local_9e;
    }
    majorV_local._3_1_ = local_9d;
    break;
  case CMP0059:
    local_9f = true;
    if ((2 < majorV) && ((majorV != 3 || (local_9f = true, 3 < minorV + 1)))) {
      local_a0 = false;
      if ((majorV == 3) && (local_a0 = false, minorV == 3)) {
        local_a0 = patchV == 0xffffffff;
      }
      local_9f = local_a0;
    }
    majorV_local._3_1_ = local_9f;
    break;
  case CMP0060:
    local_a1 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_a1 = true, 3 < minorV + 1)))) {
      local_a2 = false;
      if ((majorV == 3) && (local_a2 = false, minorV == 3)) {
        local_a2 = patchV == 0xffffffff;
      }
      local_a1 = local_a2;
    }
    majorV_local._3_1_ = local_a1;
    break;
  case CMP0061:
    local_a3 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_a3 = true, 3 < minorV + 1)))) {
      local_a4 = false;
      if ((majorV == 3) && (local_a4 = false, minorV == 3)) {
        local_a4 = patchV == 0xffffffff;
      }
      local_a3 = local_a4;
    }
    majorV_local._3_1_ = local_a3;
    break;
  case CMP0062:
    local_a5 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_a5 = true, 3 < minorV + 1)))) {
      local_a6 = false;
      if ((majorV == 3) && (local_a6 = false, minorV == 3)) {
        local_a6 = patchV == 0xffffffff;
      }
      local_a5 = local_a6;
    }
    majorV_local._3_1_ = local_a5;
    break;
  case CMP0063:
    local_a7 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_a7 = true, 3 < minorV + 1)))) {
      local_a8 = false;
      if ((majorV == 3) && (local_a8 = false, minorV == 3)) {
        local_a8 = patchV == 0xffffffff;
      }
      local_a7 = local_a8;
    }
    majorV_local._3_1_ = local_a7;
    break;
  case CMP0064:
    local_a9 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_a9 = true, 4 < minorV + 1)))) {
      local_aa = false;
      if ((majorV == 3) && (local_aa = false, minorV == 4)) {
        local_aa = patchV == 0xffffffff;
      }
      local_a9 = local_aa;
    }
    majorV_local._3_1_ = local_a9;
    break;
  case CMP0065:
    local_ab = true;
    if ((2 < majorV) && ((majorV != 3 || (local_ab = true, 4 < minorV + 1)))) {
      local_ac = false;
      if ((majorV == 3) && (local_ac = false, minorV == 4)) {
        local_ac = patchV == 0xffffffff;
      }
      local_ab = local_ac;
    }
    majorV_local._3_1_ = local_ab;
    break;
  case CMP0066:
    local_ad = true;
    if ((2 < majorV) && ((majorV != 3 || (local_ad = true, 7 < minorV + 1)))) {
      local_ae = false;
      if ((majorV == 3) && (local_ae = false, minorV == 7)) {
        local_ae = patchV == 0xffffffff;
      }
      local_ad = local_ae;
    }
    majorV_local._3_1_ = local_ad;
    break;
  case CMP0067:
    local_af = true;
    if ((2 < majorV) && ((majorV != 3 || (local_af = true, 8 < minorV + 1)))) {
      local_b0 = false;
      if ((majorV == 3) && (local_b0 = false, minorV == 8)) {
        local_b0 = patchV == 0xffffffff;
      }
      local_af = local_b0;
    }
    majorV_local._3_1_ = local_af;
    break;
  case CMP0068:
    local_b1 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_b1 = true, 9 < minorV + 1)))) {
      local_b2 = false;
      if ((majorV == 3) && (local_b2 = false, minorV == 9)) {
        local_b2 = patchV == 0xffffffff;
      }
      local_b1 = local_b2;
    }
    majorV_local._3_1_ = local_b1;
    break;
  case CMP0069:
    local_b3 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_b3 = true, 9 < minorV + 1)))) {
      local_b4 = false;
      if ((majorV == 3) && (local_b4 = false, minorV == 9)) {
        local_b4 = patchV == 0xffffffff;
      }
      local_b3 = local_b4;
    }
    majorV_local._3_1_ = local_b3;
    break;
  case CMP0070:
    local_b5 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_b5 = true, 10 < minorV + 1)))) {
      local_b6 = false;
      if ((majorV == 3) && (local_b6 = false, minorV == 10)) {
        local_b6 = patchV == 0xffffffff;
      }
      local_b5 = local_b6;
    }
    majorV_local._3_1_ = local_b5;
    break;
  case CMP0071:
    local_b7 = true;
    if ((2 < majorV) && ((majorV != 3 || (local_b7 = true, 10 < minorV + 1)))) {
      local_b8 = false;
      if ((majorV == 3) && (local_b8 = false, minorV == 10)) {
        local_b8 = patchV == 0xffffffff;
      }
      local_b7 = local_b8;
    }
    majorV_local._3_1_ = local_b7;
    break;
  case CMPCOUNT:
    majorV_local._3_1_ = false;
    break;
  default:
    majorV_local._3_1_ = false;
  }
  return majorV_local._3_1_;
}

Assistant:

static bool isPolicyNewerThan(cmPolicies::PolicyID id, unsigned int majorV,
                              unsigned int minorV, unsigned int patchV)
{
  switch (id) {
#define POLICY_CASE(ID, V_MAJOR, V_MINOR, V_PATCH)                            \
  case cmPolicies::ID:                                                        \
    return (majorV < (V_MAJOR) ||                                             \
            (majorV == (V_MAJOR) && minorV + 1 < (V_MINOR) + 1) ||            \
            (majorV == (V_MAJOR) && minorV == (V_MINOR) &&                    \
             patchV + 1 < (V_PATCH) + 1));
    CM_FOR_EACH_POLICY_ID_VERSION(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return false;
  }
  return false;
}